

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractSampleLists.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  exception *e;
  FilePath local_58;
  string local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    processLogFile(argv[1]);
    argv_local._4_4_ = 0;
  }
  else {
    de::FilePath::FilePath(&local_58,*argv);
    de::FilePath::getBaseName_abi_cxx11_(&local_38,&local_58);
    uVar1 = std::__cxx11::string::c_str();
    printf("%s: [filename]\n",uVar1);
    std::__cxx11::string::~string((string *)&local_38);
    de::FilePath::~FilePath(&local_58);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, const char* const* argv)
{
	if (argc != 2)
	{
		printf("%s: [filename]\n", de::FilePath(argv[0]).getBaseName().c_str());
		return -1;
	}

	try
	{
		processLogFile(argv[1]);
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}